

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

void Cmd_toggle(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  FBaseCVar *this;
  undefined4 extraout_var;
  UCVarValue value;
  FBaseCVar *prev;
  FBaseCVar *pFStack_18;
  
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    pcVar2 = FCommandLine::operator[](argv,1);
    this = FindCVar(pcVar2,&pFStack_18);
    if (this != (FBaseCVar *)0x0) {
      iVar1 = (*this->_vptr_FBaseCVar[4])(this,0);
      value.String = (char *)(CONCAT44(extraout_var,iVar1) & 0xffffffffffffff01 ^ 1);
      FBaseCVar::SetGenericRep(this,value,CVAR_Bool);
      pcVar2 = "false";
      if (value.Bool != false) {
        pcVar2 = "true";
      }
      Printf("\"%s\" is \"%s\"\n",this->Name,pcVar2);
    }
  }
  return;
}

Assistant:

CCMD (toggle)
{
	FBaseCVar *var, *prev;
	UCVarValue val;

	if (argv.argc() > 1)
	{
		if ( (var = FindCVar (argv[1], &prev)) )
		{
			val = var->GetGenericRep (CVAR_Bool);
			val.Bool = !val.Bool;
			var->SetGenericRep (val, CVAR_Bool);
			Printf ("\"%s\" is \"%s\"\n", var->GetName(),
				val.Bool ? "true" : "false");
		}
	}
}